

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O0

char * litString(char *str)

{
  char cVar1;
  size_t sVar2;
  char *pcStack_30;
  char ch;
  char *ptr;
  char *retval;
  size_t slen;
  char *str_local;
  
  if (str == (char *)0x0) {
    str_local = "NULL";
  }
  else {
    sVar2 = strlen(str);
    str_local = (char *)get_ioblob((sVar2 + 1) * 2);
    *str_local = '\"';
    pcStack_30 = str_local + 1;
    slen = (size_t)str;
    while( true ) {
      cVar1 = *(char *)slen;
      if (cVar1 == '\0') break;
      if (cVar1 == '\"') {
        *pcStack_30 = '\\';
        pcStack_30[1] = '\"';
        pcStack_30 = pcStack_30 + 2;
        slen = slen + 1;
      }
      else {
        *pcStack_30 = cVar1;
        pcStack_30 = pcStack_30 + 1;
        slen = slen + 1;
      }
    }
    *pcStack_30 = '\"';
    pcStack_30[1] = '\0';
  }
  return str_local;
}

Assistant:

const char *litString(const char *str)
{
    if (str) {
        const size_t slen = (strlen(str) + 1) * 2;
        char *retval = (char *) get_ioblob(slen);
        char *ptr = retval;
        *(ptr++) = '"';
        while (1) {
            const char ch = *(str++);
            if (ch == '\0') {
                *(ptr++) = '"';
                *(ptr++) = '\0';
                break;
            } else if (ch == '"') {
                *(ptr++) = '\\';
                *(ptr++) = '"';
            } else {
                *(ptr++) = ch;
            }
        }
        return retval;
    }
    return "NULL";
}